

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::tent_filter(float t)

{
  float t_local;
  undefined4 local_4;
  
  t_local = t;
  if (t < 0.0) {
    t_local = -t;
  }
  if (1.0 <= t_local) {
    local_4 = 0.0;
  }
  else {
    local_4 = 1.0 - t_local;
  }
  return local_4;
}

Assistant:

static float tent_filter(float t) /* box (*) box, bilinear/triangle */
{
  if (t < 0.0f)
    t = -t;

  if (t < 1.0f)
    return 1.0f - t;
  else
    return 0.0f;
}